

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O1

shared_ptr<vmips::VirtReg> __thiscall vmips::Memory::def(Memory *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long *in_RSI;
  undefined1 auVar4 [16];
  shared_ptr<vmips::VirtReg> sVar5;
  
  auVar4 = (**(code **)(*in_RSI + 8))();
  _Var3._M_pi = auVar4._8_8_;
  if (*auVar4._0_8_ != 'l') {
    auVar4 = (**(code **)(*in_RSI + 8))();
    _Var3._M_pi = auVar4._8_8_;
    if (*(char *)(auVar4._0_8_ + 1) != 'l') {
      (this->super_Instruction)._vptr_Instruction = (_func_int **)0x0;
      (this->target).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_00118778;
    }
  }
  (this->super_Instruction)._vptr_Instruction = (_func_int **)in_RSI[1];
  peVar2 = (element_type *)in_RSI[2];
  (this->target).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  if (peVar2 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(peVar2->parent).super___weak_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &(peVar2->parent).super___weak_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
LAB_00118778:
  sVar5.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar5.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> Memory::def() const {
    if (name()[0] == 'l' || name()[1] == 'l') {
        return target;
    }
    return nullptr;
}